

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  xmlHashTablePtr pxVar4;
  xmlEntityPtr entity;
  _xmlDict *dict;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  if (dtd->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = dtd->doc->dict;
  }
  if (type - 1U < 3) {
    ppvVar1 = &dtd->entities;
    pvVar2 = dtd->entities;
  }
  else {
    if (1 < type - 4U) {
      pxVar4 = (xmlHashTablePtr)0x0;
      if (type == 6) {
        return (xmlEntityPtr)0x0;
      }
      goto LAB_001461b6;
    }
    ppvVar1 = &dtd->pentities;
    pvVar2 = dtd->pentities;
  }
  if (pvVar2 == (void *)0x0) {
    pxVar4 = xmlHashCreateDict(0,dict);
    *ppvVar1 = pxVar4;
  }
  pxVar4 = (xmlHashTablePtr)*ppvVar1;
LAB_001461b6:
  if ((pxVar4 != (xmlHashTablePtr)0x0) &&
     (entity = xmlCreateEntity(dict,name,type,ExternalID,SystemID,content),
     entity != (xmlEntityPtr)0x0)) {
    entity->doc = dtd->doc;
    iVar3 = xmlHashAddEntry(pxVar4,name,entity);
    if (iVar3 == 0) {
      return entity;
    }
    xmlFreeEntity(entity);
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}